

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O2

int __thiscall Peers::remove(Peers *this,char *__filename)

{
  uint16_t uVar1;
  int iVar2;
  iterator __position;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  mapped_type *this_00;
  int port;
  vector<int,_std::allocator<int>_> ipPeers;
  string peerIp;
  uint local_54;
  _Vector_base<int,_std::allocator<int>_> local_50;
  string local_38;
  
  Peer::name_abi_cxx11_(&local_38,(Peer *)__filename);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
                       *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Peer::ip_abi_cxx11_(&local_38,(Peer *)__filename);
  uVar1 = Peer::port((Peer *)__filename);
  local_54 = (uint)uVar1;
  if ((_Rb_tree_header *)__position._M_node != &(this->m_peers)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>>>
                        *)this,__position);
    this->m_count = this->m_count + -1;
  }
  ip2Peers((vector<int,_std::allocator<int>_> *)&local_50,this,&local_38);
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       local_50._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       local_50._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_equals_val<const_int>)&local_54);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)&local_50,(const_iterator)__first._M_current,
             (const_iterator)local_50._M_impl.super__Vector_impl_data._M_finish);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_ip2PeerMap,&local_38);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  iVar2 = std::__cxx11::string::~string((string *)&local_38);
  return iVar2;
}

Assistant:

void Peers::remove(Peer *peer)
{
    std::map<std::string, std::unique_ptr<Peer>>::iterator pos = m_peers.find(peer->name());
    std::string peerIp = peer->ip();
    int port = peer->port();
    if (pos != m_peers.end()) {
        m_peers.erase(pos);
        --m_count;
    }
    std::vector<int> ipPeers = ip2Peers(peerIp);
    ipPeers.erase(std::remove(ipPeers.begin(), ipPeers.end(), port), ipPeers.end());
    m_ip2PeerMap[peerIp] = ipPeers;
}